

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall cmGeneratorTarget::GetSourcesProperty(cmGeneratorTarget *this)

{
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  cmCompiledGeneratorExpression *this_00;
  string *__x;
  char *pcVar4;
  string local_68;
  __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  cmGeneratorTarget *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&it);
  end = std::
        vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
        ::begin(&this->SourceEntries);
  local_38._M_current =
       (TargetPropertyEntry **)
       std::
       vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
       ::end(&this->SourceEntries);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
              ::operator*(&end);
    this_00 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&(*ppTVar3)->ge);
    __x = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it,__x);
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget::TargetPropertyEntry_*const_*,_std::vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>_>
    ::operator++(&end);
  }
  if (GetSourcesProperty()::value_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetSourcesProperty()::value_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string((string *)&GetSourcesProperty()::value_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,&GetSourcesProperty()::value_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetSourcesProperty()::value_abi_cxx11_);
    }
  }
  std::__cxx11::string::clear();
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_68,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&it,"");
  std::__cxx11::string::operator=
            ((string *)&GetSourcesProperty()::value_abi_cxx11_,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&it);
  return pcVar4;
}

Assistant:

const char* cmGeneratorTarget::GetSourcesProperty() const
{
  std::vector<std::string> values;
  for (std::vector<cmGeneratorTarget::TargetPropertyEntry *>::const_iterator
         it = this->SourceEntries.begin(),
         end = this->SourceEntries.end();
       it != end; ++it) {
    values.push_back((*it)->ge->GetInput());
  }
  static std::string value;
  value.clear();
  value = cmJoin(values, "");
  return value.c_str();
}